

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

string * __thiscall
deqp::gls::getProgramInfoLog_abi_cxx11_(string *__return_storage_ptr__,gls *this,deUint32 programGL)

{
  pointer pcVar1;
  size_t sVar2;
  char *pcVar3;
  int infoLogLen;
  vector<char,_std::allocator<char>_> infoLog;
  GLint local_3c;
  vector<char,_std::allocator<char>_> local_38;
  
  local_3c = 0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (GLchar *)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glwGetProgramiv((GLuint)this,0x8b84,&local_3c);
  std::vector<char,_std::allocator<char>_>::resize(&local_38,(long)(local_3c + 1));
  glwGetProgramInfoLog
            ((GLuint)this,
             (int)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
             (int)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,(GLsizei *)0x0,
             local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  pcVar1 = local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    pcVar3 = &DAT_00000001;
  }
  else {
    sVar2 = strlen(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    pcVar3 = pcVar1 + sVar2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar3);
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string getProgramInfoLog (const deUint32 programGL)
{
	int				infoLogLen = 0;
	vector<char>	infoLog;
	glGetProgramiv(programGL, GL_INFO_LOG_LENGTH, &infoLogLen);
	infoLog.resize(infoLogLen+1);
	glGetProgramInfoLog(programGL, (int)infoLog.size(), DE_NULL, &infoLog[0]);
	return &infoLog[0];
}